

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O3

int re_sbuff(CharBuff *buff,uint new_size)

{
  char *__src;
  char *__dest;
  
  if (new_size <= buff->buff_size) {
    new_size = buff->buff_size * 2;
  }
  buff->buff_size = new_size + 1;
  __src = buff->body;
  __dest = (char *)calloc(1,(ulong)(new_size + 1));
  if (__dest != (char *)0x0) {
    memcpy(__dest,__src,(ulong)buff->len);
    buff->body = __dest;
    free(__src);
  }
  return (uint)(__dest != (char *)0x0);
}

Assistant:

int re_sbuff(CharBuff* buff, unsigned int new_size){
    if (new_size <= buff->buff_size){
        new_size = buff->buff_size * 2;
    }
    new_size = MALLOC_SIZE(char, +new_size);
    buff->buff_size = new_size;
    char* old_buff = buff->body;
    char* new_buff = malloc(new_size);
    buff_zero(new_buff, new_size);
    if (new_buff == NULL)return false;
    buff->body = memcpy(new_buff, buff->body, buff->len);
    free(old_buff);
    return true;
}